

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O2

size_t __thiscall dgrminer::labeled_node::support(labeled_node *this,bool new_measures)

{
  mapped_type *pmVar1;
  _Base_ptr p_Var2;
  undefined7 in_register_00000031;
  size_t sVar3;
  int snapshotId;
  _Rb_tree_color local_2c;
  
  if ((int)CONCAT71(in_register_00000031,new_measures) == 0) {
    sVar3 = (this->occurrences)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  else {
    sVar3 = 0;
    for (p_Var2 = (this->occurrences)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->occurrences)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      local_2c = p_Var2[1]._M_color;
      pmVar1 = std::__detail::
               _Map_base<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->multiple_occurrences,(key_type *)&local_2c);
      sVar3 = sVar3 + (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    }
  }
  return sVar3;
}

Assistant:

size_t labeled_node::support(bool new_measures) {
	  	if (new_measures) {
		  	size_t new_support = 0;
			for (auto snapshotId : occurrences) {
			  	new_support += multiple_occurrences.at(snapshotId).size();
			}

		  	return new_support;
		}
	  	return occurrences.size();
	}